

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Verifier::VerifyKey(Verifier *this,uint8_t *p)

{
  uint8_t uVar1;
  bool bVar2;
  reference pvVar3;
  value_type existing;
  uint8_t *puStack_20;
  uint8_t packed_type;
  uint8_t *p_local;
  Verifier *this_local;
  
  puStack_20 = p;
  if (this->reuse_tracker_ != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    uVar1 = PackedType(BIT_WIDTH_8,FBT_KEY);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (this->reuse_tracker_,(long)p - (long)this->buf_);
    if (*pvVar3 == uVar1) {
      return true;
    }
    bVar2 = Check(this,*pvVar3 == '\0');
    if (!bVar2) {
      return false;
    }
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (this->reuse_tracker_,(long)p - (long)this->buf_);
    *pvVar3 = uVar1;
    puStack_20 = p;
  }
  do {
    if (this->buf_ + this->size_ <= puStack_20) {
      return false;
    }
    uVar1 = *puStack_20;
    puStack_20 = puStack_20 + 1;
  } while (uVar1 == '\0');
  return true;
}

Assistant:

bool VerifyKey(const uint8_t *p) {
    FLEX_CHECK_VERIFIED(p, PackedType(BIT_WIDTH_8, FBT_KEY));
    while (p < buf_ + size_)
      if (*p++) return true;
    return false;
  }